

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O3

Entry * __thiscall llvm::DWARFUnitIndex::getFromHash(DWARFUnitIndex *this,uint64_t S)

{
  Entry *pEVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar2 = (this->Header).NumBuckets - 1;
  uVar3 = (ulong)((uint)S & uVar2);
  pEVar1 = (this->Rows)._M_t.
           super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
  uVar4 = pEVar1[uVar3].Signature;
  if (uVar4 != S) {
    do {
      if (uVar4 == 0) {
        return (Entry *)0x0;
      }
      uVar3 = (ulong)((int)uVar3 + ((uint)(S >> 0x20) & uVar2 | 1) & uVar2);
      uVar4 = pEVar1[uVar3].Signature;
    } while (uVar4 != S);
  }
  return pEVar1 + uVar3;
}

Assistant:

const DWARFUnitIndex::Entry *DWARFUnitIndex::getFromHash(uint64_t S) const {
  uint64_t Mask = Header.NumBuckets - 1;

  auto H = S & Mask;
  auto HP = ((S >> 32) & Mask) | 1;
  while (Rows[H].getSignature() != S && Rows[H].getSignature() != 0)
    H = (H + HP) & Mask;

  if (Rows[H].getSignature() != S)
    return nullptr;

  return &Rows[H];
}